

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O0

nng_err nni_http_res_parse(nng_http *conn,void *buf,size_t n,size_t *lenp)

{
  size_t line_00;
  nni_http_res *pnVar1;
  uint8_t *line;
  nng_http_res *res;
  size_t sStack_38;
  int rv;
  size_t cnt;
  size_t len;
  size_t *lenp_local;
  size_t n_local;
  void *buf_local;
  nng_http *conn_local;
  
  cnt = 0;
  len = (size_t)lenp;
  lenp_local = (size_t *)n;
  n_local = (size_t)buf;
  buf_local = conn;
  pnVar1 = nni_http_conn_res(conn);
  do {
    res._4_4_ = http_scan_line((void *)n_local,(size_t)lenp_local,&stack0xffffffffffffffc8);
    line_00 = n_local;
    if (res._4_4_ != NNG_OK) break;
    cnt = sStack_38 + cnt;
    lenp_local = (size_t *)((long)lenp_local - sStack_38);
    if (*(char *)n_local == '\0') break;
    if (((pnVar1->data).parsed & 1U) == 0) {
      n_local = n_local + sStack_38;
      res._4_4_ = http_res_parse_line((nng_http *)buf_local,(uint8_t *)line_00);
      if (res._4_4_ == NNG_OK) {
        (pnVar1->data).parsed = true;
      }
    }
    else {
      n_local = n_local + sStack_38;
      res._4_4_ = http_parse_header((nng_http *)buf_local,(void *)line_00);
    }
  } while (res._4_4_ == NNG_OK);
  if (res._4_4_ == NNG_OK) {
    (pnVar1->data).parsed = false;
  }
  *(size_t *)len = cnt;
  return res._4_4_;
}

Assistant:

nng_err
nni_http_res_parse(nng_http *conn, void *buf, size_t n, size_t *lenp)
{

	size_t        len = 0;
	size_t        cnt;
	int           rv  = 0;
	nng_http_res *res = nni_http_conn_res(conn);
	for (;;) {
		uint8_t *line;
		if ((rv = http_scan_line(buf, n, &cnt)) != 0) {
			break;
		}

		len += cnt;
		line = buf;
		buf  = line + cnt;
		n -= cnt;

		if (*line == '\0') {
			break;
		}

		if (res->data.parsed) {
			rv = http_parse_header(conn, line);
		} else if ((rv = http_res_parse_line(conn, line)) == 0) {
			res->data.parsed = true;
		}

		if (rv != 0) {
			break;
		}
	}

	if (rv == 0) {
		res->data.parsed = false;
	}
	*lenp = len;
	return (rv);
}